

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

realtype N_VWL2Norm_Serial(N_Vector x,N_Vector w)

{
  long *in_RSI;
  long *in_RDI;
  double dVar1;
  realtype *wd;
  realtype *xd;
  realtype prodi;
  realtype sum;
  sunindextype N;
  sunindextype i;
  undefined8 local_40;
  undefined8 local_20;
  undefined4 local_14;
  
  local_20 = 0.0;
  for (local_14 = 0; local_14 < *(int *)*in_RDI; local_14 = local_14 + 1) {
    dVar1 = *(double *)(*(long *)(*in_RDI + 8) + (long)local_14 * 8) *
            *(double *)(*(long *)(*in_RSI + 8) + (long)local_14 * 8);
    local_20 = dVar1 * dVar1 + local_20;
  }
  if (0.0 < local_20) {
    local_40 = sqrt(local_20);
  }
  else {
    local_40 = 0.0;
  }
  return local_40;
}

Assistant:

realtype N_VWL2Norm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  realtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++) {
    prodi = xd[i]*wd[i];
    sum += SUNSQR(prodi);
  }

  return(SUNRsqrt(sum));
}